

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void random_group_element_jacobian_test(secp256k1_gej *gej,secp256k1_ge *ge)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  uint64_t uVar48;
  uint64_t uVar49;
  uint64_t uVar50;
  uint64_t uVar51;
  int iVar52;
  long lVar53;
  int iVar54;
  uint uVar55;
  ulong uVar56;
  long extraout_RDX;
  ulong uVar57;
  ulong uVar58;
  long lVar59;
  secp256k1_gej *psVar60;
  secp256k1_gej *a;
  secp256k1_ge *r;
  secp256k1_gej *b;
  secp256k1_gej *__src;
  secp256k1_gej *psVar61;
  secp256k1_fe *psVar62;
  secp256k1_fe *psVar63;
  secp256k1_fe *psVar64;
  ulong uVar65;
  ulong uVar66;
  secp256k1_ge *psVar67;
  secp256k1_ge *r_00;
  int *piVar68;
  bool bVar69;
  uint64_t tmp3;
  uint64_t tmp2;
  secp256k1_fe z3;
  secp256k1_fe z2;
  secp256k1_fe sStack_390;
  secp256k1_fe *psStack_360;
  secp256k1_fe sStack_350;
  secp256k1_fe sStack_320;
  secp256k1_fe sStack_2f0;
  secp256k1_fe sStack_2b8;
  secp256k1_fe sStack_288;
  secp256k1_fe sStack_258;
  secp256k1_gej *psStack_220;
  secp256k1_gej *psStack_218;
  secp256k1_fe *psStack_210;
  undefined1 *puStack_208;
  secp256k1_fe *psStack_200;
  secp256k1_fe *psStack_1f8;
  secp256k1_gej sStack_1f0;
  secp256k1_ge *psStack_150;
  int *piStack_148;
  secp256k1_gej *psStack_140;
  secp256k1_ge *psStack_138;
  code *pcStack_130;
  long lStack_128;
  secp256k1_fe sStack_120;
  secp256k1_ge *psStack_f0;
  secp256k1_fe local_90;
  secp256k1_fe local_60;
  
  psVar62 = &gej->z;
  psVar60 = (secp256k1_gej *)ge;
  random_fe_non_zero_test(psVar62);
  psVar67 = (secp256k1_ge *)psVar62;
  secp256k1_fe_verify(psVar62);
  if ((gej->z).magnitude < 9) {
    uVar58 = psVar62->n[0];
    uVar66 = (gej->z).n[1];
    uVar2 = (gej->z).n[2];
    uVar3 = (gej->z).n[3];
    uVar4 = (gej->z).n[4];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar58 * 2;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar3;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar66 * 2;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar2;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar4;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar4;
    uVar56 = SUB168(auVar7 * auVar27,0);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar56 & 0xfffffffffffff;
    auVar5 = auVar6 * auVar26 + auVar5 * auVar25 + auVar8 * ZEXT816(0x1000003d10);
    uVar57 = auVar5._0_8_;
    local_90.n[0] = uVar57 & 0xfffffffffffff;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar57 >> 0x34 | auVar5._8_8_ << 0xc;
    uVar4 = uVar4 * 2;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar58;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar4;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar66 * 2;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar3;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar2;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar2;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar56 >> 0x34 | SUB168(auVar7 * auVar27,8) << 0xc;
    auVar5 = auVar9 * auVar28 + auVar41 + auVar10 * auVar29 + auVar11 * auVar30 +
             auVar12 * ZEXT816(0x1000003d10);
    uVar56 = auVar5._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar56 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar58;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar58;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar66;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar4;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar2 * 2;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar3;
    auVar5 = auVar14 * auVar32 + auVar42 + auVar15 * auVar33;
    uVar57 = auVar5._0_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar57 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = (uVar57 & 0xfffffffffffff) << 4 | (uVar56 & 0xfffffffffffff) >> 0x30;
    auVar5 = auVar13 * auVar31 + ZEXT816(0x1000003d1) * auVar34;
    uVar57 = auVar5._0_8_;
    local_60.n[0] = uVar57 & 0xfffffffffffff;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar57 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar58 * 2;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar66;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar2;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar4;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar3;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar3;
    auVar6 = auVar17 * auVar36 + auVar44 + auVar18 * auVar37;
    uVar57 = auVar6._0_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar57 & 0xfffffffffffff;
    auVar5 = auVar16 * auVar35 + auVar43 + auVar19 * ZEXT816(0x1000003d10);
    uVar65 = auVar5._0_8_;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar57 >> 0x34 | auVar6._8_8_ << 0xc;
    local_60.n[1] = uVar65 & 0xfffffffffffff;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar65 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar58 * 2;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar2;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar66;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar66;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar3;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar4;
    auVar46 = auVar22 * auVar40 + auVar46;
    uVar58 = auVar46._0_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar58 & 0xfffffffffffff;
    auVar5 = auVar20 * auVar38 + auVar45 + auVar21 * auVar39 + auVar23 * ZEXT816(0x1000003d10);
    uVar66 = auVar5._0_8_;
    local_60.n[2] = uVar66 & 0xfffffffffffff;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = (uVar66 >> 0x34 | auVar5._8_8_ << 0xc) + local_90.n[0];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar58 >> 0x34 | auVar46._8_8_ << 0xc;
    auVar47 = auVar24 * ZEXT816(0x1000003d10) + auVar47;
    uVar58 = auVar47._0_8_;
    local_60.n[3] = uVar58 & 0xfffffffffffff;
    local_60.n[4] = (uVar58 >> 0x34 | auVar47._8_8_ << 0xc) + (uVar56 & 0xffffffffffff);
    local_60.magnitude = 1;
    local_60.normalized = 0;
    secp256k1_fe_verify(&local_60);
    secp256k1_fe_mul(&local_90,&local_60,psVar62);
    secp256k1_fe_mul(&gej->x,&ge->x,&local_60);
    secp256k1_fe_mul(&gej->y,&ge->y,&local_90);
    gej->infinity = ge->infinity;
    return;
  }
  random_group_element_jacobian_test_cold_1();
  while( true ) {
    random_fe_test(&psVar67->x);
    r = psVar67;
    secp256k1_fe_verify(&psVar67->x);
    if ((psVar67->x).normalized == 0) break;
    if ((((psVar67->x).n[3] != 0 || (psVar67->x).n[1] != 0) ||
        ((psVar67->x).n[2] != 0 || (psVar67->x).n[0] != 0)) || (psVar67->x).n[4] != 0) {
      return;
    }
  }
  random_fe_non_zero_test_cold_1();
  if (extraout_RDX == 0) {
    return;
  }
  psVar62 = &psVar60->z;
  lStack_128 = -1;
  lVar59 = 0;
  r_00 = r;
  psStack_f0 = psVar67;
  do {
    pcStack_130 = (code *)0x157a38;
    secp256k1_gej_verify((secp256k1_gej *)(psVar62 + -2));
    if ((int)psVar62[1].n[0] == 0) {
      if (lStack_128 == -1) {
        uVar50 = psVar62->n[0];
        uVar51 = psVar62->n[1];
        uVar48 = psVar62->n[2];
        uVar49 = psVar62->n[3];
        iVar54 = psVar62->magnitude;
        iVar52 = psVar62->normalized;
        (r_00->x).n[4] = psVar62->n[4];
        (r_00->x).magnitude = iVar54;
        (r_00->x).normalized = iVar52;
        (r_00->x).n[2] = uVar48;
        (r_00->x).n[3] = uVar49;
        (r_00->x).n[0] = uVar50;
        (r_00->x).n[1] = uVar51;
        lStack_128 = lVar59;
      }
      else {
        pcStack_130 = (code *)0x157a66;
        secp256k1_fe_mul(&r_00->x,&r[lStack_128].x,psVar62);
        lStack_128 = lVar59;
      }
    }
    else {
      pcStack_130 = (code *)0x157a48;
      secp256k1_ge_set_infinity(r_00);
    }
    lVar53 = lStack_128;
    lVar59 = lVar59 + 1;
    r_00 = r_00 + 1;
    psVar62 = (secp256k1_fe *)(psVar62[3].n + 1);
  } while (extraout_RDX != lVar59);
  if (lStack_128 == -1) {
    return;
  }
  psVar67 = (secp256k1_ge *)(lStack_128 * 0x68);
  a = (secp256k1_gej *)(r + lStack_128);
  b = (secp256k1_gej *)&sStack_120;
  pcStack_130 = (code *)0x157abf;
  secp256k1_fe_inv_var((secp256k1_fe *)b,(secp256k1_fe *)a);
  if (lVar53 == 0) {
    lStack_128 = 0;
    piVar68 = (int *)0x0;
  }
  else {
    lVar59 = lVar53 + -1;
    piVar68 = &psVar60[lVar53 + -1].infinity;
    psVar67 = r + -1 + lVar53;
    do {
      if (*piVar68 == 0) {
        pcStack_130 = (code *)0x157b01;
        secp256k1_fe_mul(&r[lStack_128].x,&psVar67->x,&sStack_120);
        a = (secp256k1_gej *)&sStack_120;
        pcStack_130 = (code *)0x157b1e;
        b = a;
        secp256k1_fe_mul((secp256k1_fe *)a,(secp256k1_fe *)a,&psVar60[lStack_128].z);
        lStack_128 = lVar59;
      }
      piVar68 = piVar68 + -0x26;
      psVar67 = psVar67 + -1;
      bVar69 = lVar59 != 0;
      lVar59 = lVar59 + -1;
    } while (bVar69);
  }
  if (psVar60[lStack_128].infinity == 0) {
    puVar1 = r[lStack_128].x.n + 4;
    *puVar1 = sStack_120.n[4];
    puVar1[1] = sStack_120._40_8_;
    puVar1 = r[lStack_128].x.n + 2;
    *puVar1 = sStack_120.n[2];
    puVar1[1] = sStack_120.n[3];
    r[lStack_128].x.n[0] = sStack_120.n[0];
    r[lStack_128].x.n[1] = sStack_120.n[1];
    for (lVar59 = extraout_RDX; lVar59 != 0; lVar59 = lVar59 + -1) {
      if (psVar60->infinity == 0) {
        pcStack_130 = (code *)0x157b94;
        secp256k1_ge_set_gej_zinv(r,psVar60,&r->x);
      }
      pcStack_130 = (code *)0x157b9c;
      secp256k1_ge_verify(r);
      r = r + 1;
      psVar60 = psVar60 + 1;
    }
    return;
  }
  pcStack_130 = test_gej_cmov;
  secp256k1_ge_set_all_gej_var_cold_1();
  __src = &sStack_1f0;
  psVar61 = &sStack_1f0;
  psStack_1f8 = (secp256k1_fe *)0x157bea;
  psStack_150 = psVar67;
  piStack_148 = piVar68;
  psStack_140 = psVar60;
  psStack_138 = r;
  pcStack_130 = (code *)lVar59;
  memcpy(&sStack_1f0,b,0x98);
  psStack_1f8 = (secp256k1_fe *)0x157bf2;
  secp256k1_gej_verify(&sStack_1f0);
  psStack_1f8 = (secp256k1_fe *)0x157bfa;
  secp256k1_gej_verify(a);
  psStack_1f8 = (secp256k1_fe *)0x157c07;
  secp256k1_fe_cmov(&sStack_1f0.x,&a->x,0);
  psVar62 = &a->y;
  psStack_1f8 = (secp256k1_fe *)0x157c1a;
  secp256k1_fe_cmov(&sStack_1f0.y,psVar62,0);
  psVar64 = &sStack_1f0.z;
  psVar63 = &a->z;
  psStack_1f8 = (secp256k1_fe *)0x157c30;
  secp256k1_fe_cmov(psVar64,psVar63,0);
  psStack_1f8 = (secp256k1_fe *)0x157c38;
  secp256k1_gej_verify(&sStack_1f0);
  psStack_1f8 = (secp256k1_fe *)0x157c43;
  psVar60 = b;
  iVar54 = gej_xyz_equals_gej(&sStack_1f0,b);
  if (iVar54 == 0) {
    psStack_1f8 = (secp256k1_fe *)0x157cda;
    test_gej_cmov_cold_2();
  }
  else {
    psStack_1f8 = (secp256k1_fe *)0x157c56;
    secp256k1_gej_verify(&sStack_1f0);
    psStack_1f8 = (secp256k1_fe *)0x157c5e;
    secp256k1_gej_verify(a);
    psStack_1f8 = (secp256k1_fe *)0x157c6e;
    secp256k1_fe_cmov(&sStack_1f0.x,&a->x,1);
    psStack_1f8 = (secp256k1_fe *)0x157c80;
    secp256k1_fe_cmov(&sStack_1f0.y,psVar62,1);
    psStack_1f8 = (secp256k1_fe *)0x157c90;
    secp256k1_fe_cmov(psVar64,psVar63,1);
    sStack_1f0.infinity = sStack_1f0.infinity & 0xfffffffeU | a->infinity & 1U;
    psStack_1f8 = (secp256k1_fe *)0x157cb4;
    secp256k1_gej_verify(&sStack_1f0);
    psStack_1f8 = (secp256k1_fe *)0x157cbf;
    psVar60 = a;
    iVar54 = gej_xyz_equals_gej(&sStack_1f0,a);
    __src = psVar61;
    if (iVar54 != 0) {
      return;
    }
  }
  psStack_1f8 = (secp256k1_fe *)gej_xyz_equals_gej;
  test_gej_cmov_cold_1();
  psStack_1f8 = psVar63;
  psStack_200 = psVar62;
  puStack_208 = (undefined1 *)&sStack_1f0;
  psStack_210 = psVar64;
  psStack_218 = b;
  psStack_220 = a;
  if ((*(int *)((long)__src + 0x90) != psVar60->infinity) || (*(int *)((long)__src + 0x90) != 0)) {
    return;
  }
  psStack_360 = (secp256k1_fe *)0x157d2c;
  memcpy(&sStack_2b8,__src,0x98);
  psVar62 = &sStack_350;
  psStack_360 = (secp256k1_fe *)0x157d41;
  memcpy(psVar62,psVar60,0x98);
  psStack_360 = (secp256k1_fe *)0x157d49;
  secp256k1_fe_normalize(&sStack_2b8);
  psStack_360 = (secp256k1_fe *)0x157d59;
  secp256k1_fe_normalize(&sStack_288);
  psStack_360 = (secp256k1_fe *)0x157d69;
  secp256k1_fe_normalize(&sStack_258);
  psStack_360 = (secp256k1_fe *)0x157d71;
  secp256k1_fe_normalize(psVar62);
  psVar63 = &sStack_320;
  psStack_360 = (secp256k1_fe *)0x157d7e;
  secp256k1_fe_normalize(psVar63);
  psVar64 = &sStack_2f0;
  psStack_360 = (secp256k1_fe *)0x157d8b;
  secp256k1_fe_normalize(psVar64);
  psStack_360 = (secp256k1_fe *)0x157d93;
  secp256k1_fe_verify(&sStack_2b8);
  psStack_360 = (secp256k1_fe *)0x157d9b;
  secp256k1_fe_verify(psVar62);
  if (sStack_2b8.normalized == 0) {
    psStack_360 = (secp256k1_fe *)0x157ea0;
    gej_xyz_equals_gej_cold_6();
LAB_00157ea0:
    psVar63 = psVar62;
    psStack_360 = (secp256k1_fe *)0x157ea5;
    gej_xyz_equals_gej_cold_5();
LAB_00157ea5:
    psStack_360 = (secp256k1_fe *)0x157eaa;
    gej_xyz_equals_gej_cold_4();
LAB_00157eaa:
    psVar64 = psVar63;
    psStack_360 = (secp256k1_fe *)0x157eaf;
    gej_xyz_equals_gej_cold_3();
  }
  else {
    if (sStack_350.normalized == 0) goto LAB_00157ea0;
    uVar55 = 4;
    do {
      uVar58 = sStack_350.n[uVar55];
      uVar66 = sStack_2b8.n[uVar55];
      if ((uVar66 >= uVar58 && uVar66 != uVar58) || (uVar66 < uVar58)) break;
      bVar69 = uVar55 != 0;
      uVar55 = uVar55 - 1;
    } while (bVar69);
    psStack_360 = (secp256k1_fe *)0x157de5;
    secp256k1_fe_verify(&sStack_288);
    psStack_360 = (secp256k1_fe *)0x157ded;
    secp256k1_fe_verify(psVar63);
    if (sStack_288.normalized == 0) goto LAB_00157ea5;
    if (sStack_320.normalized == 0) goto LAB_00157eaa;
    uVar55 = 4;
    do {
      uVar58 = sStack_320.n[uVar55];
      uVar66 = sStack_288.n[uVar55];
      if ((uVar66 >= uVar58 && uVar66 != uVar58) || (uVar66 < uVar58)) break;
      bVar69 = uVar55 != 0;
      uVar55 = uVar55 - 1;
    } while (bVar69);
    psStack_360 = (secp256k1_fe *)0x157e3e;
    secp256k1_fe_verify(&sStack_258);
    psStack_360 = (secp256k1_fe *)0x157e46;
    secp256k1_fe_verify(psVar64);
    if (sStack_258.normalized != 0) {
      if (sStack_2f0.normalized != 0) {
        uVar55 = 4;
        do {
          if (sStack_258.n[uVar55] != sStack_2f0.n[uVar55]) {
            return;
          }
          bVar69 = uVar55 != 0;
          uVar55 = uVar55 - 1;
        } while (bVar69);
        return;
      }
      goto LAB_00157eb4;
    }
  }
  psStack_360 = (secp256k1_fe *)0x157eb4;
  gej_xyz_equals_gej_cold_2();
LAB_00157eb4:
  psStack_360 = (secp256k1_fe *)secp256k1_gej_has_quad_y_var;
  gej_xyz_equals_gej_cold_1();
  if ((int)psVar64[3].n[0] == 0) {
    psStack_360 = &sStack_258;
    secp256k1_fe_mul(&sStack_390,psVar64 + 1,psVar64 + 2);
    secp256k1_fe_is_square_var(&sStack_390);
    return;
  }
  return;
}

Assistant:

static void random_group_element_jacobian_test(secp256k1_gej *gej, const secp256k1_ge *ge) {
    secp256k1_fe z2, z3;
    random_fe_non_zero_test(&gej->z);
    secp256k1_fe_sqr(&z2, &gej->z);
    secp256k1_fe_mul(&z3, &z2, &gej->z);
    secp256k1_fe_mul(&gej->x, &ge->x, &z2);
    secp256k1_fe_mul(&gej->y, &ge->y, &z3);
    gej->infinity = ge->infinity;
}